

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O0

CheckStreamRez * __thiscall
MPEG2StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,MPEG2StreamReader *this,uint8_t *buffer,int len)

{
  uint uVar1;
  uint8_t *puVar2;
  string local_128;
  BitStreamException *e;
  uint8_t *puStack_f8;
  uint8_t unitType;
  uint8_t *nal;
  MPEGPictureHeader frame;
  uint8_t extType;
  bool pulldownFound;
  bool pictureFound;
  bool sliceFound;
  uint8_t *nextNal;
  undefined1 local_50 [8];
  BitStreamReader bitReader;
  uint8_t *end;
  int len_local;
  uint8_t *buffer_local;
  MPEG2StreamReader *this_local;
  CheckStreamRez *rez;
  
  CheckStreamRez::CheckStreamRez(__return_storage_ptr__);
  bitReader._24_8_ = buffer + len;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_50);
  frame.bitReader.m_bitLeft._3_1_ = 0;
  frame.bitReader.m_bitLeft._2_1_ = 0;
  frame.bitReader.m_bitLeft._1_1_ = 0;
  frame.bitReader.m_bitLeft._0_1_ = '\0';
  MPEGPictureHeader::MPEGPictureHeader((MPEGPictureHeader *)&nal,0);
  for (puStack_f8 = MPEGHeader::findNextMarker(buffer,(uint8_t *)bitReader._24_8_);
      puStack_f8 <= (uint8_t *)(bitReader._24_8_ + -0x20);
      puStack_f8 = MPEGHeader::findNextMarker(puStack_f8 + 4,(uint8_t *)bitReader._24_8_)) {
    e._7_1_ = puStack_f8[3];
    if ((e._7_1_ == 0) || (0xaf < e._7_1_)) {
      uVar1 = (uint)e._7_1_;
      if (uVar1 == 0) {
        puVar2 = MPEGPictureHeader::deserialize
                           ((MPEGPictureHeader *)&nal,puStack_f8 + 4,
                            (bitReader._24_8_ - (long)puStack_f8) + -4);
        if (puVar2 == (uint8_t *)0x0) goto LAB_0031548d;
        frame.bitReader.m_bitLeft._2_1_ = 1;
      }
      else if (uVar1 != 0xb2) {
        if (uVar1 == 0xb3) {
          puVar2 = MPEGHeader::findNextMarker(puStack_f8 + 4,(uint8_t *)bitReader._24_8_);
          puVar2 = MPEGSequenceHeader::deserialize
                             (&this->m_sequence,puStack_f8 + 4,
                              (int64_t)(puVar2 + (-4 - (long)puStack_f8)));
          if (puVar2 == (uint8_t *)0x0) goto LAB_0031548d;
          (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
          this->spsFound = true;
        }
        else if (uVar1 == 0xb5) {
          BitStreamReader::setBuffer
                    ((BitStreamReader *)local_50,puStack_f8 + 4,(uint8_t *)bitReader._24_8_);
          frame.bitReader.m_bitLeft._0_1_ =
               BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_50,4);
          if ((uchar)frame.bitReader.m_bitLeft == '\x01') {
            MPEGSequenceHeader::deserializeExtension(&this->m_sequence,(BitStreamReader *)local_50);
          }
          else if ((uchar)frame.bitReader.m_bitLeft == '\b') {
            MPEGPictureHeader::deserializeCodingExtension
                      ((MPEGPictureHeader *)&nal,(BitStreamReader *)local_50);
            frame.bitReader.m_bitLeft._1_1_ =
                 (frame.bitReader.m_bitLeft._1_1_ & 1) != 0 || frame.intra_dc_precision != '\0';
          }
        }
        else if (1 < uVar1 - 0xb7) goto LAB_0031548d;
      }
    }
    else {
      frame.bitReader.m_bitLeft._3_1_ = 1;
    }
  }
  if ((((this->spsFound & 1U) != 0) && ((frame.bitReader.m_bitLeft._2_1_ & 1) != 0)) &&
     ((frame.bitReader.m_bitLeft._3_1_ & 1) != 0)) {
    CodecInfo::operator=(&__return_storage_ptr__->codecInfo,&::mpeg2CodecInfo);
    MPEGSequenceHeader::getStreamDescr_abi_cxx11_(&local_128,&this->m_sequence);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->streamDescr,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    if ((frame.bitReader.m_bitLeft._1_1_ & 1) != 0) {
      std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->streamDescr," (pulldown)")
      ;
    }
  }
LAB_0031548d:
  e._0_4_ = 1;
  MPEGPictureHeader::~MPEGPictureHeader((MPEGPictureHeader *)&nal);
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez MPEG2StreamReader::checkStream(uint8_t* buffer, int len)
{
    CheckStreamRez rez;
    uint8_t* end = buffer + len;
    BitStreamReader bitReader{};
    uint8_t* nextNal = nullptr;
    bool sliceFound = false;
    bool pictureFound = false;
    bool pulldownFound = false;
    uint8_t extType = 0;
    MPEGPictureHeader frame(0);
    for (uint8_t* nal = MPEGHeader::findNextMarker(buffer, end); nal <= end - 32;
         nal = MPEGHeader::findNextMarker(nal + 4, end))
    {
        uint8_t unitType = nal[3];
        try
        {
            if (unitType >= SLICE_MIN_START_SHORT_CODE && unitType <= SLICE_MAX_START_SHORT_CODE)
                sliceFound = true;
            else
                switch (unitType)
                {
                case EXT_START_SHORT_CODE:
                    bitReader.setBuffer(nal + 4, end);
                    extType = bitReader.getBits<uint8_t>(4);
                    if (extType == SEQUENCE_EXT)
                    {
                        m_sequence.deserializeExtension(bitReader);
                    }
                    else if (extType == PICTURE_CODING_EXT)
                    {
                        frame.deserializeCodingExtension(bitReader);
                        pulldownFound |= frame.repeat_first_field > 0;
                    }
                    break;
                case SEQ_END_SHORT_CODE:
                case GOP_START_SHORT_CODE:
                case USER_START_SHORT_CODE:
                    break;
                case PICTURE_START_SHORT_CODE:
                    if (frame.deserialize(nal + 4, end - nal - 4) == nullptr)
                        return rez;
                    pictureFound = true;
                    break;
                case SEQ_START_SHORT_CODE:
                    nextNal = MPEGHeader::findNextMarker(nal + 4, end);
                    if (m_sequence.deserialize(nal + 4, nextNal - nal - 4) == nullptr)
                        return rez;
                    m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
                    spsFound = true;
                    break;
                default:
                    return rez;
                }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            // return rez;
        }
    }
    if (spsFound && pictureFound && sliceFound)
    {
        rez.codecInfo = mpeg2CodecInfo;
        rez.streamDescr = m_sequence.getStreamDescr();
        if (pulldownFound)
            rez.streamDescr += " (pulldown)";
    }
    return rez;
}